

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecUnary(Parser *this,string *msg,bool emptyAllowed)

{
  int iVar1;
  uint uVar2;
  CompileContext *this_00;
  pointer *__ptr;
  char ***pppcVar3;
  optional<enact::Token> permission;
  optional<enact::Token> region;
  size_type __dnew;
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  char ***local_80;
  char ***local_78 [3];
  undefined1 local_60 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  __buckets_ptr local_40 [3];
  char local_28;
  _Alloc_hider local_20;
  
  iVar1 = *(int *)&msg[7]._M_dataplus._M_p;
  if (iVar1 == 0xf) {
    advance((Parser *)msg);
    local_58._0_8_ = (char ***)0x1c;
    local_a0._16_8_ = &local_80;
    local_a0._16_8_ =
         std::__cxx11::string::_M_create((ulong *)(local_a0 + 0x10),(ulong)(local_60 + 8));
    local_80 = (char ***)local_58._0_8_;
    builtin_strncpy((char *)(local_a0._16_8_ + 0xc),"ename af",8);
    builtin_strncpy((char *)(local_a0._16_8_ + 0x14),"ter \'?\'.",8);
    *(undefined8 *)local_a0._16_8_ = 0x6465746365707845;
    *(undefined8 *)(local_a0._16_8_ + 8) = 0x6d616e6570797420;
    local_a0._24_8_ = local_58._0_8_;
    *(char *)(local_a0._16_8_ + local_58._0_8_) = '\0';
    expectTypenamePrecUnary((Parser *)local_b0,msg,(bool)((char)local_a0 + '\x10'));
    this_00 = (CompileContext *)operator_new(0x30);
    local_58._0_8_ = local_b0._0_8_;
    OptionalTypename::OptionalTypename
              ((OptionalTypename *)this_00,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               (local_60 + 8));
    if ((CompileContext *)local_58._0_8_ != (CompileContext *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 8))();
    }
    this->m_context = this_00;
    local_78[0] = local_80;
    pppcVar3 = (char ***)local_a0._16_8_;
    if ((char ****)local_a0._16_8_ == &local_80) {
      return (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>)this;
    }
  }
  else {
    if (iVar1 != 6) {
      expectTypenamePrecParametric(this,msg,emptyAllowed);
      return (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>)this;
    }
    advance((Parser *)msg);
    local_60[0] = '\0';
    uVar2 = *(uint *)&msg[7]._M_dataplus._M_p;
    if ((uVar2 == 0x39) || (uVar2 == 0x35)) {
      advance((Parser *)msg);
      std::optional<enact::Token>::operator=
                ((optional<enact::Token> *)(local_a0 + 0x10),(Token *)&msg[5].field_2);
      uVar2 = *(uint *)&msg[7]._M_dataplus._M_p;
    }
    local_28 = '\0';
    if ((uVar2 < 0x40) && ((0xa002000000000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      advance((Parser *)msg);
      std::optional<enact::Token>::operator=
                ((optional<enact::Token> *)(local_60 + 8),(Token *)&msg[5].field_2);
    }
    local_20._M_p = (pointer)0x1c;
    local_b0._0_8_ = (CompileContext *)(local_b0 + 0x10);
    local_b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_b0,(ulong)&local_20);
    local_a0._0_8_ = local_20._M_p;
    builtin_strncpy((char *)((long)&(((CompileContext *)local_b0._0_8_)->m_source)._M_string_length
                            + 4),"ename af",8);
    builtin_strncpy((char *)((long)&(((CompileContext *)local_b0._0_8_)->m_source).field_2 + 4),
                    "ter \'&\'.",8);
    (((CompileContext *)local_b0._0_8_)->m_source)._M_dataplus._M_p = (pointer)0x6465746365707845;
    (((CompileContext *)local_b0._0_8_)->m_source)._M_string_length = 0x6d616e6570797420;
    local_b0._8_8_ = local_20._M_p;
    local_20._M_p[(long)&((CompileContext *)local_b0._0_8_)->m_source] = '\0';
    expectTypenamePrecUnary((Parser *)local_b8,msg,SUB81(local_b0,0));
    if ((CompileContext *)local_b0._0_8_ != (CompileContext *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    std::
    make_unique<enact::ReferenceTypename,std::optional<enact::Token>,std::optional<enact::Token>,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
              ((optional<enact::Token> *)local_b0,(optional<enact::Token> *)(local_a0 + 0x10),
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               (local_60 + 8));
    this->m_context = (CompileContext *)local_b0._0_8_;
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_b8)->_M_dataplus)._M_p + 8))();
    }
    if ((local_28 == '\x01') &&
       (local_28 = '\0',
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_58._8_8_ !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_40)) {
      operator_delete((void *)local_58._8_8_,(long)local_40[0] + 1);
    }
    if (local_60[0] != '\x01') {
      return (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>)this;
    }
    local_60[0] = '\0';
    pppcVar3 = (char ***)local_a0._24_8_;
    if ((char ****)local_a0._24_8_ == local_78) {
      return (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>)this;
    }
  }
  operator_delete(pppcVar3,(ulong)((long)local_78[0] + 1));
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecUnary(const std::string &msg, bool emptyAllowed) {
        if (consume(TokenType::AMPERSAND)) {
            std::optional<Token> permission;
            if (consume(TokenType::MUT) || consume(TokenType::IMM)) {
                permission = m_previous;
            }

            std::optional<Token> region;
            if (consume(TokenType::SO) || consume(TokenType::RC) || consume(TokenType::GC)) {
                region = m_previous;
            }

            std::unique_ptr<const Typename> referringTypename = expectTypenamePrecUnary("Expected typename after '&'.");

            return std::make_unique<ReferenceTypename>(
                    std::move(permission),
                    std::move(region),
                    std::move(referringTypename));
        }
        if (consume(TokenType::QUESTION)) {
            return std::make_unique<OptionalTypename>(expectTypenamePrecUnary("Expected typename after '?'."));
        }

        return expectTypenamePrecParametric(msg, emptyAllowed);
    }